

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator_test.cc
# Opt level: O0

int main(void)

{
  bool bVar1;
  Title *this;
  Decorator *this_00;
  AsteriskDecorator *pAVar2;
  PlusDecorator *this_01;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  Decorator *local_78;
  Decorator *decorator;
  string value;
  allocator local_39;
  string local_38 [32];
  Title *local_18;
  Title *title;
  
  title._4_4_ = 0;
  this = (Title *)operator_new(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"docorate!",&local_39);
  Title::Title(this,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = this;
  (**(this->super_Element)._vptr_Element)();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &decorator,"docorate!");
  if (!bVar1) {
    __assert_fail("value == \"docorate!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/structural/decorator_test.cc"
                  ,10,"int main()");
  }
  this_00 = (Decorator *)operator_new(0x10);
  Decorator::Decorator(this_00,&local_18->super_Element);
  local_78 = this_00;
  (**(this_00->super_Element)._vptr_Element)(local_98);
  std::__cxx11::string::operator=((string *)&decorator,local_98);
  std::__cxx11::string::~string(local_98);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &decorator,"docorate!");
  if (!bVar1) {
    __assert_fail("value == \"docorate!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/structural/decorator_test.cc"
                  ,0xe,"int main()");
  }
  pAVar2 = (AsteriskDecorator *)operator_new(0x10);
  AsteriskDecorator::AsteriskDecorator(pAVar2,&local_18->super_Element);
  local_78 = (Decorator *)pAVar2;
  (**(pAVar2->super_Decorator).super_Element._vptr_Element)(local_b8);
  std::__cxx11::string::operator=((string *)&decorator,local_b8);
  std::__cxx11::string::~string(local_b8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &decorator,"*docorate!*");
  if (!bVar1) {
    __assert_fail("value == \"*docorate!*\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/structural/decorator_test.cc"
                  ,0x12,"int main()");
  }
  this_01 = (PlusDecorator *)operator_new(0x10);
  pAVar2 = (AsteriskDecorator *)operator_new(0x10);
  AsteriskDecorator::AsteriskDecorator(pAVar2,&local_18->super_Element);
  PlusDecorator::PlusDecorator(this_01,(Element *)pAVar2);
  local_78 = (Decorator *)this_01;
  (**(this_01->super_Decorator).super_Element._vptr_Element)(local_d8);
  std::__cxx11::string::operator=((string *)&decorator,local_d8);
  std::__cxx11::string::~string(local_d8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &decorator,"+*docorate!*+");
  if (!bVar1) {
    __assert_fail("value == \"+*docorate!*+\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/structural/decorator_test.cc"
                  ,0x16,"int main()");
  }
  std::__cxx11::string::~string((string *)&decorator);
  return title._4_4_;
}

Assistant:

int main() {
  Title* title = new Title("docorate!");
  std::string value = title->print();
  assert(value == "docorate!");

  Decorator* decorator = new Decorator(title);
  value = decorator->print();
  assert(value == "docorate!");

  decorator = new AsteriskDecorator(title);
  value = decorator->print();
  assert(value == "*docorate!*");

  decorator = new PlusDecorator(new AsteriskDecorator(title));
  value = decorator->print();
  assert(value == "+*docorate!*+");
}